

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *
pbrt::
returnArray<pbrt::Vector2<float>,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pbrt::Vector2<float>(*)(float_const*,pbrt::FileLoc_const*)>
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *values,ParsedParameter *param,
          int nPerItem,_func_Vector2<float>_float_ptr_FileLoc_ptr *convert)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  const_reference pvVar5;
  Tuple2<pbrt::Vector2,_float> *pTVar6;
  int in_ECX;
  long in_RDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  code *in_R8;
  undefined8 uVar7;
  undefined8 extraout_XMM0_Qb;
  size_t i;
  size_t n;
  vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *v;
  allocator_type *in_stack_ffffffffffffff80;
  vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  int *in_stack_ffffffffffffffa8;
  Tuple2<pbrt::Vector2,_float> TVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  FileLoc *in_stack_ffffffffffffffc0;
  undefined1 local_32 [26];
  long local_18;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_10;
  
  args = in_RDI;
  local_32._10_8_ = in_R8;
  local_32._22_4_ = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::empty
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x72fc22);
  if (bVar2) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,args);
  }
  sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10);
  if (sVar3 % (ulong)(long)(int)local_32._22_4_ == 0) {
    *(undefined1 *)(local_18 + 0xd8) = 1;
    sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10);
    uVar4 = sVar3 / (ulong)(long)(int)local_32._22_4_;
    local_32[1] = 0;
    this = (vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *)local_32;
    local_32._2_8_ = uVar4;
    std::allocator<pbrt::Vector2<float>_>::allocator((allocator<pbrt::Vector2<float>_> *)0x72fcdb);
    std::vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>::vector
              (this,uVar4,in_stack_ffffffffffffff80);
    std::allocator<pbrt::Vector2<float>_>::~allocator((allocator<pbrt::Vector2<float>_> *)0x72fcfb);
    for (uVar4 = 0; uVar7 = local_32._10_8_, uVar4 < (ulong)local_32._2_8_; uVar4 = uVar4 + 1) {
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (local_10,(long)(int)local_32._22_4_ * uVar4);
      uVar7 = (*(code *)uVar7)(pvVar5,local_18 + 0x40);
      auVar1._8_8_ = extraout_XMM0_Qb;
      auVar1._0_8_ = uVar7;
      TVar8 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(auVar1);
      pTVar6 = &std::vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>::
                operator[]((vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *)
                           in_RDI,uVar4)->super_Tuple2<pbrt::Vector2,_float>;
      *pTVar6 = TVar8;
    }
    return (vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *)args;
  }
  ErrorExit<std::__cxx11::string_const&,int&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
}

Assistant:

static std::vector<ReturnType> returnArray(const ValuesType &values,
                                           const ParsedParameter &param, int nPerItem,
                                           C convert) {
    if (values.empty())
        ErrorExit(&param.loc, "No values provided for \"%s\".", param.name);
    if (values.size() % nPerItem)
        ErrorExit(&param.loc, "Number of values provided for \"%s\" not a multiple of %d",
                  param.name, nPerItem);

    param.lookedUp = true;
    size_t n = values.size() / nPerItem;
    std::vector<ReturnType> v(n);
    for (size_t i = 0; i < n; ++i)
        v[i] = convert(&values[nPerItem * i], &param.loc);
    return v;
}